

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

lws_vhost * lws_select_vhost(lws_context *context,int port,char *servername)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  lws_vhost *plVar5;
  char *pcVar6;
  size_t sVar7;
  lws_vhost *plVar8;
  lws_vhost *plVar9;
  
  plVar9 = context->vhost_list;
  plVar5 = (lws_vhost *)strlen(servername);
  pcVar6 = strchr(servername,0x3a);
  plVar8 = (lws_vhost *)(pcVar6 + -(long)servername);
  if (pcVar6 == (char *)0x0) {
    plVar8 = plVar5;
  }
  if (plVar9 != (lws_vhost *)0x0) {
    plVar5 = plVar9;
    do {
      if ((plVar5->listen_port == port) &&
         (iVar2 = strncmp(plVar5->name,servername,(ulong)plVar8 & 0xffffffff), iVar2 == 0)) {
        _lws_log(8,"SNI: Found: %s\n",servername);
        return plVar5;
      }
      plVar5 = plVar5->vhost_next;
    } while (plVar5 != (lws_vhost *)0x0);
  }
  iVar2 = (int)plVar8;
  do {
    if (plVar9 == (lws_vhost *)0x0) {
      plVar5 = context->vhost_list;
      while( true ) {
        if (plVar5 == (lws_vhost *)0x0) {
          return (lws_vhost *)0x0;
        }
        if ((port != 0) && (plVar5->listen_port == port)) break;
        plVar5 = plVar5->vhost_next;
      }
      _lws_log(8,"%s: vhost match to %s based on port %d\n","lws_select_vhost",plVar5->name,port);
      return plVar5;
    }
    pcVar6 = plVar9->name;
    sVar7 = strlen(pcVar6);
    if ((((port == 0) || (plVar9->listen_port != port)) ||
        (uVar3 = (uint)sVar7, iVar2 + -2 < (int)uVar3)) ||
       ((servername[(int)(~uVar3 + iVar2)] != '.' ||
        (iVar4 = strncmp(pcVar6,servername + ((long)iVar2 - (long)(int)uVar3),sVar7 & 0xffffffff),
        iVar4 != 0)))) {
      plVar9 = plVar9->vhost_next;
      bVar1 = true;
    }
    else {
      bVar1 = false;
      _lws_log(8,"SNI: Found %s on wildcard: %s\n",servername,pcVar6);
      plVar5 = plVar9;
    }
  } while (bVar1);
  return plVar5;
}

Assistant:

struct lws_vhost *
lws_select_vhost(struct lws_context *context, int port, const char *servername)
{
	struct lws_vhost *vhost = context->vhost_list;
	const char *p;
	int n, colon;

	n = (int)strlen(servername);
	colon = n;
	p = strchr(servername, ':');
	if (p)
		colon = lws_ptr_diff(p, servername);

	/* Priotity 1: first try exact matches */

	while (vhost) {
		if (port == vhost->listen_port &&
		    !strncmp(vhost->name, servername, (unsigned int)colon)) {
			lwsl_info("SNI: Found: %s\n", servername);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/*
	 * Priority 2: if no exact matches, try matching *.vhost-name
	 * unintentional matches are possible but resolve to x.com for *.x.com
	 * which is reasonable.  If exact match exists we already chose it and
	 * never reach here.  SSL will still fail it if the cert doesn't allow
	 * *.x.com.
	 */
	vhost = context->vhost_list;
	while (vhost) {
		int m = (int)strlen(vhost->name);
		if (port && port == vhost->listen_port &&
		    m <= (colon - 2) &&
		    servername[colon - m - 1] == '.' &&
		    !strncmp(vhost->name, servername + colon - m, (unsigned int)m)) {
			lwsl_info("SNI: Found %s on wildcard: %s\n",
				    servername, vhost->name);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/* Priority 3: match the first vhost on our port */

	vhost = context->vhost_list;
	while (vhost) {
		if (port && port == vhost->listen_port) {
			lwsl_info("%s: vhost match to %s based on port %d\n",
					__func__, vhost->name, port);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/* no match */

	return NULL;
}